

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_rd.h
# Opt level: O0

void model_rd_for_sb(AV1_COMP *cpi,BLOCK_SIZE bsize,MACROBLOCK *x,MACROBLOCKD *xd,int plane_from,
                    int plane_to,int *out_rate_sum,int64_t *out_dist_sum,uint8_t *skip_txfm_sb,
                    int64_t *skip_sse_sb,int *plane_rate,int64_t *plane_sse,int64_t *plane_dist)

{
  char cVar1;
  BLOCK_SIZE BVar2;
  uint uVar3;
  uint uVar4;
  int *rate_00;
  long lVar5;
  macroblock_plane *pmVar6;
  long in_RCX;
  long in_RDX;
  BLOCK_SIZE in_SIL;
  int in_R8D;
  int in_R9D;
  undefined4 *in_stack_00000008;
  long *in_stack_00000010;
  long in_stack_00000018;
  long *in_stack_00000020;
  int64_t dist;
  long in_stack_00000030;
  int rate;
  int64_t sse;
  int bh;
  int bw;
  BLOCK_SIZE plane_bsize;
  macroblockd_plane *pd;
  macroblock_plane *p;
  int64_t total_sse;
  int64_t dist_sum;
  int64_t rate_sum;
  int ref;
  int plane;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  macroblockd_plane *in_stack_ffffffffffffff70;
  macroblock_plane *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa4;
  int64_t *dist_00;
  long local_40;
  long local_38;
  int local_2c;
  
  cVar1 = *(char *)(**(long **)(in_RCX + 0x1eb8) + 0x10);
  local_38 = 0;
  local_40 = 0;
  dist_00 = (int64_t *)0x0;
  local_2c = in_R8D;
  while ((local_2c <= in_R9D && ((local_2c == 0 || ((*(byte *)(in_RCX + 0xc) & 1) != 0))))) {
    rate_00 = (int *)(in_RDX + (long)local_2c * 0x88);
    lVar5 = in_RCX + 0x10 + (long)local_2c * 0xa30;
    BVar2 = get_plane_block_size(in_SIL,*(int *)(lVar5 + 4),*(int *)(lVar5 + 8));
    in_stack_ffffffffffffffa4 = CONCAT13(BVar2,(int3)in_stack_ffffffffffffffa4);
    uVar3 = (uint)block_size_wide[BVar2];
    uVar4 = (uint)block_size_high[BVar2];
    pmVar6 = (macroblock_plane *)
             calculate_sse((MACROBLOCKD *)
                           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                           in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                           in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
    model_rd_from_sse((AV1_COMP *)CONCAT44(in_stack_ffffffffffffffa4,uVar3),
                      (MACROBLOCK *)CONCAT44(uVar4,in_stack_ffffffffffffff98),
                      (BLOCK_SIZE)((ulong)pmVar6 >> 0x38),(int)pmVar6,
                      CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                      in_stack_ffffffffffffff84,rate_00,dist_00);
    if (local_2c == 0) {
      in_stack_ffffffffffffff78 = pmVar6;
      if (0xfffffffe < (long)pmVar6) {
        in_stack_ffffffffffffff78 = (macroblock_plane *)0xffffffff;
      }
      *(int *)(in_RDX + 0x25660 + (long)(int)cVar1 * 4) = (int)in_stack_ffffffffffffff78;
    }
    dist_00 = (int64_t *)((long)&pmVar6->src_diff + (long)dist_00);
    local_38 = in_stack_ffffffffffffff8c + local_38;
    local_40 = CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80) + local_40;
    if (dist != 0) {
      *(int *)(dist + (long)local_2c * 4) = in_stack_ffffffffffffff8c;
    }
    if (in_stack_00000030 != 0) {
      *(macroblock_plane **)(in_stack_00000030 + (long)local_2c * 8) = pmVar6;
    }
    if (sse != 0) {
      *(ulong *)(sse + (long)local_2c * 8) =
           CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80);
    }
    local_2c = local_2c + 1;
  }
  if (in_stack_00000018 != 0) {
    *(bool *)in_stack_00000018 = dist_00 == (int64_t *)0x0;
  }
  if (in_stack_00000020 != (long *)0x0) {
    *in_stack_00000020 = (long)dist_00 << 4;
  }
  if (0x7ffffffe < local_38) {
    local_38 = 0x7fffffff;
  }
  *in_stack_00000008 = (int)local_38;
  *in_stack_00000010 = local_40;
  return;
}

Assistant:

static inline void model_rd_for_sb(const AV1_COMP *const cpi, BLOCK_SIZE bsize,
                                   MACROBLOCK *x, MACROBLOCKD *xd,
                                   int plane_from, int plane_to,
                                   int *out_rate_sum, int64_t *out_dist_sum,
                                   uint8_t *skip_txfm_sb, int64_t *skip_sse_sb,
                                   int *plane_rate, int64_t *plane_sse,
                                   int64_t *plane_dist) {
  // Note our transform coeffs are 8 times an orthogonal transform.
  // Hence quantizer step is also 8 times. To get effective quantizer
  // we need to divide by 8 before sending to modeling function.
  int plane;
  const int ref = xd->mi[0]->ref_frame[0];

  int64_t rate_sum = 0;
  int64_t dist_sum = 0;
  int64_t total_sse = 0;

  assert(bsize < BLOCK_SIZES_ALL);

  for (plane = plane_from; plane <= plane_to; ++plane) {
    if (plane && !xd->is_chroma_ref) break;
    struct macroblock_plane *const p = &x->plane[plane];
    struct macroblockd_plane *const pd = &xd->plane[plane];
    const BLOCK_SIZE plane_bsize =
        get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);
    assert(plane_bsize < BLOCK_SIZES_ALL);
    const int bw = block_size_wide[plane_bsize];
    const int bh = block_size_high[plane_bsize];
    int64_t sse;
    int rate;
    int64_t dist;

    sse = calculate_sse(xd, p, pd, bw, bh);

    model_rd_from_sse(cpi, x, plane_bsize, plane, sse, bw * bh, &rate, &dist);

    if (plane == 0) x->pred_sse[ref] = (unsigned int)AOMMIN(sse, UINT_MAX);

    total_sse += sse;
    rate_sum += rate;
    dist_sum += dist;
    if (plane_rate) plane_rate[plane] = rate;
    if (plane_sse) plane_sse[plane] = sse;
    if (plane_dist) plane_dist[plane] = dist;
    assert(rate_sum >= 0);
  }

  if (skip_txfm_sb) *skip_txfm_sb = total_sse == 0;
  if (skip_sse_sb) *skip_sse_sb = total_sse << 4;
  rate_sum = AOMMIN(rate_sum, INT_MAX);
  *out_rate_sum = (int)rate_sum;
  *out_dist_sum = dist_sum;
}